

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O2

int __thiscall
capnp::TwoPartyServer::AcceptedConnection::init(AcceptedConnection *this,EVP_PKEY_CTX *ctx)

{
  int in_EAX;
  int extraout_EAX;
  Own<kj::Function<kj::String_(const_kj::Exception_&)>::Iface,_std::nullptr_t> OStack_28;
  anon_class_8_1_898bcfc2_for_f local_18;
  
  if (ctx[0x18] == (EVP_PKEY_CTX)0x1) {
    local_18.func = (Function<kj::String_(const_kj::Exception_&)> *)(ctx + 0x20);
    kj::Function<kj::String(kj::Exception_const&)>::
    Function<capnp::TwoPartyServer::AcceptedConnection::init(capnp::TwoPartyServer&)::_lambda(kj::Exception_const&)_1_>
              ((Function<kj::String(kj::Exception_const&)> *)&OStack_28,&local_18);
    capnp::_::RpcSystemBase::setTraceEncoder
              (&(this->rpcSystem).super_RpcSystemBase,
               (Function<kj::String_(const_kj::Exception_&)> *)&OStack_28);
    kj::Own<kj::Function<kj::String_(const_kj::Exception_&)>::Iface,_std::nullptr_t>::dispose
              (&OStack_28);
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

void init(TwoPartyServer& parent) {
    KJ_IF_SOME(func, parent.traceEncoder) {
      rpcSystem.setTraceEncoder([&func](const kj::Exception& e) {
        return func(e);
      });
    }
  }